

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O0

bool __thiscall
StringKMerFactoryNC::create_kmers
          (StringKMerFactoryNC *this,string *s,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *mers)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  uint64_t *puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  KMerFactory *in_RSI;
  unsigned_long *in_RDI;
  uint64_t p;
  uint64_t *puVar2;
  uint64_t *rkmer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__n;
  
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[1] = 0;
  puVar2 = (uint64_t *)0x0;
  __n = in_RDX;
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
  std::__cxx11::string::size();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,(size_type)__n);
  while (rkmer = puVar2, puVar1 = (uint64_t *)std::__cxx11::string::size(), puVar2 < puVar1) {
    std::__cxx11::string::operator[]((ulong)in_RSI);
    KMerFactory::fillKBuf
              (in_RSI,(uchar)((ulong)__n >> 0x38),rkmer,(uint64_t *)in_RDX,(int64_t *)this_00);
    puVar2 = (uint64_t *)((long)rkmer + 1);
    if ((long)(ulong)(byte)*in_RDI <= (long)in_RDI[1]) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                (this_00,in_RDI);
    }
  }
  return false;
}

Assistant:

const bool create_kmers(const std::string &s, std::vector<uint64_t> &mers) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        mers.reserve(mers.size()+s.size());
        while (p < s.size()) {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                mers.emplace_back(fkmer);
            }
        }
        return false;
    }